

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TexFormat::emulate_mthd(MthdD3D56TexFormat *this)

{
  uint uVar1;
  uint local_14;
  uint32_t rval;
  MthdD3D56TexFormat *this_local;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  local_14 = uVar1 & 0xfffff7a6;
  if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x54) &&
     (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x35) >> 0x3d == 1)) {
    local_14 = uVar1 & 0xfffff0a6;
  }
  if ((this->which & 1U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffff7fff |
         0x8000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[0] = local_14;
  }
  if ((this->which & 2U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffdfffff |
         0x200000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_format[1] = local_14;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = val & 0xfffff7a6;
		if (cls == 0x54 && extr(val, 8, 3) == 1)
			insrt(rval, 8, 3, 0);
		if (which & 1) {
			insrt(exp.valid[1], 15, 1, 1);
			exp.d3d56_tex_format[0] = rval;
		}
		if (which & 2) {
			insrt(exp.valid[1], 21, 1, 1);
			exp.d3d56_tex_format[1] = rval;
		}
	}